

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

void PaAlsaStream_Terminate(PaAlsaStream *self)

{
  PaError PVar1;
  
  if (self == (PaAlsaStream *)0x0) {
    __assert_fail("self",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x88f,"void PaAlsaStream_Terminate(PaAlsaStream *)");
  }
  if ((self->capture).pcm != (snd_pcm_t *)0x0) {
    PaAlsaStreamComponent_Terminate(&self->capture);
  }
  if ((self->playback).pcm != (snd_pcm_t *)0x0) {
    PaAlsaStreamComponent_Terminate(&self->playback);
  }
  PaUtil_FreeMemory(self->pfds);
  PVar1 = PaUnixMutex_Terminate(&self->stateMtx);
  if (PVar1 == 0) {
    PaUtil_FreeMemory(self);
    return;
  }
  __assert_fail("paNoError == __pa_assert_error_id",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                ,0x89b,"void PaAlsaStream_Terminate(PaAlsaStream *)");
}

Assistant:

static void PaAlsaStream_Terminate( PaAlsaStream *self )
{
    assert( self );

    if( self->capture.pcm )
    {
        PaAlsaStreamComponent_Terminate( &self->capture );
    }
    if( self->playback.pcm )
    {
        PaAlsaStreamComponent_Terminate( &self->playback );
    }

    PaUtil_FreeMemory( self->pfds );
    ASSERT_CALL_( PaUnixMutex_Terminate( &self->stateMtx ), paNoError );

    PaUtil_FreeMemory( self );
}